

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::OneofDescriptorProto::Clear(OneofDescriptorProto *this)

{
  uint32_t *puVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_1d;
  uint local_1c;
  OneofDescriptorProto *pOStack_18;
  uint32_t cached_has_bits;
  OneofDescriptorProto *this_local;
  
  this_local = (OneofDescriptorProto *)&this->field_0;
  local_1c = 0;
  pOStack_18 = this;
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  local_1c = *puVar1;
  if ((local_1c & 3) != 0) {
    if ((local_1c & 1) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty(&(this->field_0)._impl_.name_);
    }
    if ((local_1c & 2) != 0) {
      if ((this->field_0)._impl_.options_ == (OneofOptions *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_30,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0x1779,"_impl_.options_ != nullptr");
        pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar2);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_30);
      }
      OneofOptions::Clear((this->field_0)._impl_.options_);
    }
  }
  internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void OneofDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.OneofDescriptorProto)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.name_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.options_ != nullptr);
      _impl_.options_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}